

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamStandardIndex::AdjustRegion
          (BamStandardIndex *this,BamRegion *region,uint32_t *begin,uint32_t *end)

{
  pointer pRVar1;
  RefVector *pRVar2;
  BamException *this_00;
  ulong uVar3;
  uint32_t uVar4;
  ulong uVar5;
  string local_68;
  string local_48;
  
  pRVar2 = BamReaderPrivate::GetReferenceData((this->super_BamIndex).m_reader);
  uVar5 = (ulong)region->LeftRefID;
  pRVar1 = (pRVar2->super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(pRVar2->super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>)
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3) *
          -0x3333333333333333;
  if (uVar5 <= uVar3 && uVar3 - uVar5 != 0) {
    if (pRVar1[uVar5].RefLength <= region->LeftPosition) {
      this_00 = (BamException *)__cxa_allocate_exception(0x28);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"BamStandardIndex::AdjustRegion","");
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"invalid region requested","");
      BamException::BamException(this_00,&local_68,&local_48);
      __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
    }
    *begin = region->LeftPosition;
    uVar4 = region->RightPosition;
    if (((int)uVar4 < 1 || region->RightRefID < 0) || region->LeftRefID != region->RightRefID) {
      uVar5 = (ulong)region->LeftRefID;
      if (uVar3 < uVar5 || uVar3 - uVar5 == 0) goto LAB_0019766f;
      uVar4 = pRVar1[uVar5].RefLength;
    }
    *end = uVar4;
    return;
  }
LAB_0019766f:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void BamStandardIndex::AdjustRegion(const BamRegion& region, uint32_t& begin, uint32_t& end)
{

    // retrieve references from reader
    const RefVector& references = m_reader->GetReferenceData();

    // LeftPosition cannot be greater than or equal to reference length
    if (region.LeftPosition >= references.at(region.LeftRefID).RefLength)
        throw BamException("BamStandardIndex::AdjustRegion", "invalid region requested");

    // set region 'begin'
    begin = (unsigned int)region.LeftPosition;

    // if right bound specified AND left&right bounds are on same reference
    // OK to use right bound position as region 'end'
    if (region.isRightBoundSpecified() && (region.LeftRefID == region.RightRefID))
        end = (unsigned int)region.RightPosition;

    // otherwise, set region 'end' to last reference base
    else
        end = (unsigned int)references.at(region.LeftRefID).RefLength;
}